

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

int __thiscall
helics::apps::Connector::makeTargetConnection
          (Connector *this,string_view origin,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList,
          unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *possibleConnections,
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *aliases,function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *callback)

{
  apps *__n;
  size_t sVar1;
  int iVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int unaff_EBX;
  int iVar6;
  apps *this_00;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *aliases_00;
  pointer pCVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  string_view sVar14;
  string_view target;
  string_view target_00;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  interfaceAliasList;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> aliasOptions;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> connectionOptions;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  undefined1 local_e0 [8];
  _Rb_tree_node_base _Stack_d8;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> local_b0;
  undefined1 local_98 [8];
  _Rb_tree_node_base local_90;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_68;
  long local_60;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  target._M_len = origin._M_str;
  this_00 = (apps *)origin._M_len;
  local_68 = (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)tagList;
  buildPossibleConnectionList(&local_58,this,origin,tagList);
  bVar12 = local_58.
           super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           local_58.
           super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (bVar12) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    pCVar7 = local_58.
             super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar3 = CLI::std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&possibleConnections->_M_h,&pCVar7->interface2);
      if (iVar3.
          super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
          _M_cur == (__node_type *)0x0) {
        if ((aliases->_M_h)._M_element_count != 0) {
          sVar14._M_str = (char *)aliases;
          sVar14._M_len = (size_t)(pCVar7->interface2)._M_str;
          generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)local_98,(apps *)(pCVar7->interface2)._M_len,sVar14,
                          (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           *)tagList);
          p_Var5 = local_90._M_left;
          if (local_90._M_left == &local_90) {
            bVar13 = true;
          }
          else {
            do {
              sVar1 = *(size_t *)(p_Var5 + 1);
              if ((sVar1 != (pCVar7->interface2)._M_len) ||
                 ((uVar9 = 5, sVar1 != 0 &&
                  (iVar2 = bcmp(p_Var5[1]._M_parent,(pCVar7->interface2)._M_str,sVar1), iVar2 != 0))
                 )) {
                iVar3 = CLI::std::
                        _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::find(&possibleConnections->_M_h,(key_type *)(p_Var5 + 1));
                if (iVar3.
                    super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  uVar9 = 0;
                }
                else {
                  local_b0.
                  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                       (undefined4)(pCVar7->interface2)._M_len;
                  local_b0.
                  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                       *(undefined4 *)((long)&(pCVar7->interface2)._M_len + 4);
                  local_b0.
                  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
                       *(undefined4 *)&(pCVar7->interface2)._M_str;
                  local_b0.
                  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                  ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                       *(undefined4 *)((long)&(pCVar7->interface2)._M_str + 4);
                  if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
                    local_e0 = (undefined1  [8])this_00;
                    _Stack_d8._0_8_ = target._M_len;
                    std::__throw_bad_function_call();
                  }
                  local_e0 = (undefined1  [8])this_00;
                  _Stack_d8._0_8_ = target._M_len;
                  (*callback->_M_invoker)
                            ((_Any_data *)callback,
                             (basic_string_view<char,_std::char_traits<char>_> *)local_e0,
                             (basic_string_view<char,_std::char_traits<char>_> *)&local_b0);
                  iVar6 = iVar6 + 1;
                  bVar13 = this->matchMultiple;
                  uVar9 = (uint)bVar13 + (uint)bVar13 * 2 + 1;
                  if (bVar13 == false) {
                    unaff_EBX = iVar6;
                  }
                }
              }
              if ((uVar9 != 5) && (uVar9 != 0)) goto LAB_002a061b;
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
            } while (p_Var5 != &local_90);
            uVar9 = 0;
LAB_002a061b:
            bVar13 = (uVar9 & 3) == 0;
          }
          std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_98);
          if (!bVar13) {
            bVar13 = false;
            goto LAB_002a064c;
          }
        }
LAB_002a064a:
        bVar13 = true;
      }
      else {
        local_e0 = (undefined1  [8])(pCVar7->interface2)._M_len;
        _Stack_d8._0_8_ = (pCVar7->interface2)._M_str;
        local_98 = (undefined1  [8])this_00;
        local_90._0_8_ = target._M_len;
        if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*callback->_M_invoker)
                  ((_Any_data *)callback,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_98,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_e0);
        iVar6 = iVar6 + 1;
        if (this->matchMultiple != false) goto LAB_002a064a;
        bVar13 = false;
        unaff_EBX = iVar6;
      }
LAB_002a064c:
      if (!bVar13) break;
      pCVar7 = pCVar7 + 1;
      bVar12 = pCVar7 == local_58.
                         super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar12);
  }
  iVar2 = unaff_EBX;
  if ((bVar12) && (iVar2 = iVar6, (aliases->_M_h)._M_element_count != 0)) {
    target._M_str = (char *)aliases;
    generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)local_98,this_00,target,
                    (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     *)tagList);
    for (p_Var5 = local_90._M_left; p_Var5 != &local_90;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      __n = *(apps **)(p_Var5 + 1);
      sVar14 = *(string_view *)(p_Var5 + 1);
      if ((__n == this_00) &&
         ((__n == (apps *)0x0 ||
          (iVar2 = bcmp(p_Var5[1]._M_parent,target._M_len,(size_t)__n), iVar2 == 0)))) {
        iVar10 = 7;
      }
      else {
        aliases_00 = local_68;
        buildPossibleConnectionList
                  (&local_b0,this,sVar14,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
        lVar8 = CONCAT44(local_b0.
                         super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_b0.
                         super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
        lVar11 = CONCAT44(local_b0.
                          super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                          local_b0.
                          super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_);
        local_60 = lVar11;
        if (lVar8 != lVar11) {
          do {
            iVar3 = CLI::std::
                    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(&possibleConnections->_M_h,(key_type *)(lVar8 + 0x10));
            if (iVar3.
                super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              if ((aliases->_M_h)._M_element_count != 0) {
                target_00._M_str = (char *)aliases;
                target_00._M_len = *(size_t *)(lVar8 + 0x18);
                generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)local_e0,*(apps **)(lVar8 + 0x10),target_00,aliases_00);
                for (p_Var4 = _Stack_d8._M_left; iVar10 = 10, p_Var4 != &_Stack_d8;
                    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
                  sVar1 = *(size_t *)(p_Var5 + 1);
                  if ((sVar1 != *(size_t *)(lVar8 + 0x10)) ||
                     ((iVar10 = 0xb, sVar1 != 0 &&
                      (iVar2 = bcmp(p_Var5[1]._M_parent,*(void **)(lVar8 + 0x18),sVar1), iVar2 != 0)
                      ))) {
                    iVar3 = CLI::std::
                            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            ::find(&possibleConnections->_M_h,(key_type *)(p_Var4 + 1));
                    if (iVar3.
                        super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                        ._M_cur == (__node_type *)0x0) {
                      iVar10 = 0;
                    }
                    else {
                      local_40._M_len._0_4_ = *(undefined4 *)(lVar8 + 0x10);
                      local_40._M_len._4_4_ = *(undefined4 *)(lVar8 + 0x14);
                      local_40._M_str._0_4_ = *(undefined4 *)(lVar8 + 0x18);
                      local_40._M_str._4_4_ = *(undefined4 *)(lVar8 + 0x1c);
                      local_f0._M_len = (size_t)this_00;
                      local_f0._M_str = target._M_len;
                      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
                        std::__throw_bad_function_call();
                      }
                      (*callback->_M_invoker)((_Any_data *)callback,&local_f0,&local_40);
                      iVar6 = iVar6 + 1;
                      bVar12 = this->matchMultiple;
                      iVar10 = (uint)bVar12 + (uint)bVar12 * 8 + 1;
                      if (bVar12 == false) {
                        unaff_EBX = iVar6;
                      }
                    }
                  }
                  if ((iVar10 != 0xb) && (iVar10 != 0)) break;
                }
                if (iVar10 == 10) {
                  iVar10 = 0;
                }
                std::
                _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)local_e0);
                lVar11 = local_60;
                iVar2 = unaff_EBX;
                if (iVar10 != 0) goto LAB_002a08d3;
              }
LAB_002a08cf:
              iVar10 = 0;
              iVar2 = unaff_EBX;
            }
            else {
              local_f0._M_len = *(undefined8 *)(lVar8 + 0x10);
              local_f0._M_str = *(char **)(lVar8 + 0x18);
              if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
                local_e0 = (undefined1  [8])this_00;
                _Stack_d8._0_8_ = target._M_len;
                std::__throw_bad_function_call();
              }
              local_e0 = (undefined1  [8])this_00;
              _Stack_d8._0_8_ = target._M_len;
              (*callback->_M_invoker)
                        ((_Any_data *)callback,
                         (basic_string_view<char,_std::char_traits<char>_> *)local_e0,&local_f0);
              iVar6 = iVar6 + 1;
              iVar10 = 1;
              iVar2 = iVar6;
              if (this->matchMultiple != false) goto LAB_002a08cf;
            }
LAB_002a08d3:
            unaff_EBX = iVar2;
            if (iVar10 != 0) goto LAB_002a08f7;
            lVar8 = lVar8 + 0x50;
          } while (lVar8 != lVar11);
        }
        iVar10 = 8;
LAB_002a08f7:
        if (iVar10 == 8) {
          iVar10 = 0;
        }
        CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
        ~vector(&local_b0);
      }
      if ((iVar10 != 7) && (iVar10 != 0)) goto LAB_002a0941;
    }
    iVar10 = 6;
LAB_002a0941:
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_98);
    if ((iVar10 == 0) || (iVar2 = unaff_EBX, iVar10 == 6)) {
      iVar2 = iVar6;
    }
  }
  CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::~vector
            (&local_58);
  return iVar2;
}

Assistant:

int Connector::makeTargetConnection(
    std::string_view origin,
    const std::vector<std::size_t>& tagList,
    std::unordered_set<std::string_view>& possibleConnections,
    const std::unordered_multimap<std::string_view, std::string_view>& aliases,
    const std::function<void(std::string_view, std::string_view)>& callback)
{
    int matched{0};
    auto connectionOptions = buildPossibleConnectionList(origin, tagList);
    for (const auto& option : connectionOptions) {
        auto located = possibleConnections.find(option.interface2);
        if (located != possibleConnections.end()) {
            /* source, target*/
            callback(origin, option.interface2);
            ++matched;
            if (!matchMultiple) {
                return matched;
            }

        } else {
            if (!aliases.empty()) {
                auto aliasList = generateAliases(option.interface2, aliases);
                for (const auto& alias : aliasList) {
                    if (alias == option.interface2) {
                        continue;
                    }
                    located = possibleConnections.find(alias);
                    if (located != possibleConnections.end()) {
                        callback(origin, option.interface2);
                        ++matched;
                        if (!matchMultiple) {
                            return matched;
                        }
                        break;
                    }
                }
            }
        }
    }
    if (!aliases.empty()) {
        auto aliasList = generateAliases(origin, aliases);
        for (const auto& alias : aliasList) {
            if (alias == origin) {
                continue;
            }
            auto aliasOptions = buildPossibleConnectionList(alias, tagList);
            for (const auto& option : aliasOptions) {
                auto located = possibleConnections.find(option.interface2);
                if (located != possibleConnections.end()) {
                    /* source, target*/
                    callback(origin, option.interface2);
                    ++matched;
                    if (!matchMultiple) {
                        return matched;
                    }

                } else {
                    if (!aliases.empty()) {
                        auto interfaceAliasList = generateAliases(option.interface2, aliases);
                        for (const auto& interfaceAlias : interfaceAliasList) {
                            if (alias == option.interface2) {
                                continue;
                            }
                            located = possibleConnections.find(interfaceAlias);
                            if (located != possibleConnections.end()) {
                                callback(origin, option.interface2);
                                ++matched;
                                if (!matchMultiple) {
                                    return matched;
                                }
                                break;
                            }
                        }
                    }
                }
            }
        }
    }
    return matched;
}